

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void highbd_inv_txfm2d_add_16x4_sse4_1
               (int32_t *input,uint16_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob,
               int bd)

{
  byte in_CL;
  int32_t *in_RDI;
  byte in_R8B;
  int in_stack_00000008;
  int i_1;
  __m128i *buf1_cur;
  int i;
  __m128i *buf1_ptr;
  int32_t *input_row;
  __m128i buf0 [16];
  int lr_flip;
  int ud_flip;
  transform_1d_sse4_1 col_txfm;
  transform_1d_sse4_1 row_txfm;
  int buf_size_w_div8;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i buf1 [16];
  int in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  __m128i *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  int iVar1;
  longlong *local_278;
  longlong local_268 [2];
  int in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  int in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  uint16_t *in_stack_fffffffffffffdb8;
  __m128i *in_stack_fffffffffffffdc0;
  int local_160;
  int local_15c;
  transform_1d_sse4_1 local_158;
  transform_1d_sse4_1 local_150;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  char *local_130;
  longlong local_128 [34];
  byte local_16;
  byte local_15;
  int32_t *local_8;
  
  local_130 = av1_inv_txfm_shift_ls[in_R8B];
  local_16 = in_R8B;
  local_15 = in_CL;
  local_8 = in_RDI;
  local_134 = get_txw_idx(in_R8B);
  local_138 = get_txh_idx(local_16);
  local_13c = tx_size_wide[local_16];
  local_140 = tx_size_high[local_16];
  local_144 = local_13c >> 2;
  local_150 = highbd_txfm_all_1d_zeros_w8_arr[local_134][""[local_15]][2];
  local_158 = highbd_txfm_all_1d_zeros_w8_arr[local_138][""[local_15]][0];
  get_flip_cfg(local_15,&local_15c,&local_160);
  load_buffer_32bit_input(local_8,4,&local_268,local_13c);
  (*local_150)(&local_268,&local_268,0xc,0,in_stack_00000008,-(int)*local_130);
  if (local_160 == 0) {
    local_278 = local_268;
  }
  else {
    flip_buf_sse2(&local_268,(__m128i *)local_128,local_13c);
    local_278 = local_128;
  }
  for (iVar1 = 0; iVar1 < local_144; iVar1 = iVar1 + 1) {
    in_stack_fffffffffffffd78 = (__m128i *)(local_278 + (long)(iVar1 * local_140) * 2);
    transpose_32bit_4x4(in_stack_fffffffffffffd78,in_stack_fffffffffffffd78);
    (*local_158)(in_stack_fffffffffffffd78,in_stack_fffffffffffffd78,0xc,1,in_stack_00000008,0);
  }
  av1_round_shift_array_32_sse4_1
            ((__m128i *)CONCAT44(iVar1,in_stack_fffffffffffffd80),in_stack_fffffffffffffd78,
             in_stack_fffffffffffffd74,in_stack_fffffffffffffd70);
  for (iVar1 = 0; iVar1 < local_13c >> 3; iVar1 = iVar1 + 1) {
    highbd_write_buffer_8xn_sse4_1
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb4,
               in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,in_stack_fffffffffffffda8);
  }
  return;
}

Assistant:

static void highbd_inv_txfm2d_add_16x4_sse4_1(const int32_t *input,
                                              uint16_t *output, int stride,
                                              TX_TYPE tx_type, TX_SIZE tx_size,
                                              int eob, const int bd) {
  (void)eob;
  __m128i buf1[16];
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int buf_size_w_div8 = txfm_size_col >> 2;
  const transform_1d_sse4_1 row_txfm =
      highbd_txfm_all_1d_zeros_w8_arr[txw_idx][hitx_1d_tab[tx_type]][2];
  const transform_1d_sse4_1 col_txfm =
      highbd_txfm_all_1d_zeros_w8_arr[txh_idx][vitx_1d_tab[tx_type]][0];

  assert(col_txfm != NULL);
  assert(row_txfm != NULL);
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  // 1st stage: column transform
  __m128i buf0[16];
  const int32_t *input_row = input;
  load_buffer_32bit_input(input_row, 4, buf0, txfm_size_col);

  row_txfm(buf0, buf0, INV_COS_BIT, 0, bd, -shift[0]);

  __m128i *buf1_ptr;
  if (lr_flip) {
    flip_buf_sse2(buf0, buf1, txfm_size_col);
    buf1_ptr = buf1;
  } else {
    buf1_ptr = buf0;
  }

  // 2nd stage: column transform
  for (int i = 0; i < buf_size_w_div8; i++) {
    __m128i *buf1_cur = buf1_ptr + i * txfm_size_row;
    transpose_32bit_4x4(buf1_cur, buf1_cur);
    col_txfm(buf1_cur, buf1_cur, INV_COS_BIT, 1, bd, 0);
  }
  av1_round_shift_array_32_sse4_1(buf1_ptr, buf1_ptr, txfm_size_col, -shift[1]);

  // write to buffer
  for (int i = 0; i < (txfm_size_col >> 3); i++) {
    highbd_write_buffer_8xn_sse4_1(buf1_ptr + i * txfm_size_row * 2,
                                   output + 8 * i, stride, ud_flip,
                                   txfm_size_row, bd);
  }
}